

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O2

NDeviceChannel * __thiscall
NDevice::getChannel(NDeviceChannel *__return_storage_ptr__,NDevice *this,int index)

{
  pointer pNVar1;
  
  pNVar1 = (this->channels).super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (index < (int)((ulong)((long)(this->channels).
                                  super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar1) >> 6))
  {
    NDeviceChannel::NDeviceChannel(__return_storage_ptr__,pNVar1 + index);
  }
  else {
    NDeviceChannel::NDeviceChannel(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

NDeviceChannel NDevice::getChannel(int index) const{
    if (index >= (int)channels.size()) {
        return NDeviceChannel();
    }
    return channels[index];
}